

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

uint2048 * from_issue_339::modInverse(uint2048 A,uint2048 M)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uintwide_t<2048U,_unsigned_int,_void,_false> *__src;
  uintwide_t<4096U,_unsigned_int,_void,_false> *__src_00;
  ulong uVar6;
  unsigned_fast_type i;
  long lVar7;
  uint2048 *in_RDI;
  uint4096 t;
  other_wide_integer_type other_1;
  uint4096 m0;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_e30;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_c30;
  undefined1 local_a30 [256];
  undefined1 auStack_930 [256];
  undefined1 local_830 [256];
  undefined1 auStack_730 [256];
  uintwide_t<4096U,_unsigned_int,_void,_false> local_630;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_430 [2];
  uintwide_t<4096U,_unsigned_int,_void,_false> local_230;
  
  memset(local_630.values.super_array<unsigned_int,_128UL>.elems + 0x40,0,0x100);
  memcpy(&local_630,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,0x100);
  memset(&local_230,0,0x200);
  local_c30.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
  memset(local_c30.values.super_array<unsigned_int,_128UL>.elems + 1,0,0x1fc);
  math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::uintwide_t<int>
            ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30,1,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  lVar7 = 0xfc;
  do {
    if (lVar7 == -4) {
      memset(in_RDI,0,0x100);
      return in_RDI;
    }
    piVar1 = (int *)((long)(((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108)->
                           values).super_array<unsigned_int,_64UL>.elems + lVar7);
    piVar2 = (int *)((long)local_e30.values.super_array<unsigned_int,_128UL>.elems + lVar7);
    lVar7 = lVar7 + -4;
  } while (*piVar1 == *piVar2);
  while( true ) {
    math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::uintwide_t<int>
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30,1,
               (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
    lVar7 = 0xfc;
    do {
      if (lVar7 == -4) goto LAB_001328a3;
      uVar3 = *(uint *)((long)local_e30.values.super_array<unsigned_int,_128UL>.elems + lVar7);
      uVar4 = *(uint *)(&stack0x00000008 + lVar7);
      lVar7 = lVar7 + -4;
    } while (uVar4 == uVar3);
    if (uVar4 <= uVar3) break;
    memcpy(&local_e30,&stack0x00000008,0x100);
    __src = math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::operator/=
                      ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30,
                       (uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108);
    memcpy(local_830,__src,0x100);
    lVar7 = 0;
    memset(auStack_730,0,0x100);
    memset(auStack_930,0,0x100);
    memcpy(local_a30,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,0x100);
    memcpy(local_430,&stack0x00000008,0x100);
    memset(&local_e30,0,0x100);
    math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::eval_divide_knuth
              (local_430,(uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,
               (uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_e30);
    memcpy(local_430,&local_e30,0x100);
    memcpy((uintwide_t<2048U,_unsigned_int,_void,_false> *)&stack0x00000108,local_430,0x100);
    memcpy(&stack0x00000008,local_a30,0x100);
    memcpy(local_a30,&local_230,0x200);
    memcpy(&local_e30,local_830,0x200);
    __src_00 = math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator*=
                         (&local_e30,&local_230);
    memcpy(local_430,__src_00,0x200);
    memcpy(&local_e30,&local_c30,0x200);
    bVar5 = false;
    do {
      uVar6 = ((ulong)local_e30.values.super_array<unsigned_int,_128UL>.elems[lVar7] - (ulong)bVar5)
              - (ulong)local_430[0].values.super_array<unsigned_int,_64UL>.elems[lVar7];
      local_e30.values.super_array<unsigned_int,_128UL>.elems[lVar7] = (value_type_conflict)uVar6;
      bVar5 = uVar6 >> 0x20 != 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    memcpy(&local_230,&local_e30,0x200);
    memcpy(&local_c30,local_a30,0x200);
  }
LAB_001328a3:
  math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::uintwide_t<int>
            (&local_e30,0,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  lVar7 = 0x1fc;
  do {
    if (lVar7 == -4) goto LAB_001328e7;
    uVar3 = *(uint *)((long)local_e30.values.super_array<unsigned_int,_128UL>.elems + lVar7);
    uVar4 = *(uint *)((long)local_c30.values.super_array<unsigned_int,_128UL>.elems + lVar7);
    lVar7 = lVar7 + -4;
  } while (uVar4 == uVar3);
  if (uVar4 <= uVar3) {
    math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator+=
              (&local_c30,&local_630);
  }
LAB_001328e7:
  memcpy(in_RDI,&local_c30,0x100);
  return in_RDI;
}

Assistant:

auto modInverse(uint2048 A, uint2048 M) -> uint2048 // NOLINT(readability-identifier-naming)
  {
    uint4096 m0 = M;
    uint4096 y  = 0;
    uint4096 x  = 1;

    if(M == 1)
    {
      return 0; // LCOV_EXCL_LINE
    }

    while (A > 1)
    {
      uint4096 q = A / M;
      uint4096 t = M;

      M = A % M;
      A = t;
      t = y;

      y = x - q * y;
      x = t;
    }

    if (x < 0)
    {
      x += m0; // LCOV_EXCL_LINE
    }

    return x;
  }